

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O1

bool __thiscall
llvm::DWARFDebugLine::Prologue::getFileNameByIndex
          (Prologue *this,uint64_t FileIndex,StringRef CompDir,FileLineInfoKind Kind,string *Result,
          Style Style)

{
  Child CVar1;
  ulong uVar2;
  pointer pDVar3;
  bool bVar4;
  FileNameEntry *this_00;
  anon_union_8_2_fc7899a5_for_OptionalStorage<const_char_*,_true>_2 aVar5;
  Optional<const_char_*> OVar6;
  Twine local_f0;
  Twine local_d8;
  Twine local_c0;
  undefined1 local_a8 [8];
  StringRef CompDir_local;
  StringRef FileName;
  undefined1 local_78;
  undefined7 uStack_77;
  Child local_68;
  SmallString<16U> FilePath;
  
  CompDir_local.Data = (char *)CompDir.Length;
  local_a8 = (undefined1  [8])CompDir.Data;
  if ((Kind == None) || (bVar4 = hasFileAtIndex(this,FileIndex), !bVar4)) {
    return false;
  }
  this_00 = getFileNameEntry(this,FileIndex);
  OVar6 = DWARFFormValue::getAsCString(&this_00->Name);
  aVar5 = OVar6.Storage.field_0;
  if (((undefined1  [16])OVar6.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0)
  goto LAB_00d7dcf0;
  CompDir_local.Length = (size_t)aVar5;
  if (aVar5.value == (char *)0x0) {
    FileName.Data = (char *)0x0;
  }
  else {
    FileName.Data = (char *)strlen(aVar5.value);
  }
  if (Kind == AbsoluteFilePath) {
    Twine::Twine((Twine *)&local_68,(StringRef *)&CompDir_local.Length);
    bVar4 = isPathAbsoluteOnWindowsOrPosix((Twine *)&local_68);
    if (!bVar4) {
      CVar1 = (Child)&FilePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                      super_SmallVectorTemplateBase<char,_true>.
                      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      FilePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
      super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX = (void *)0x1000000000;
      FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts[8].buffer
      [0] = (char  [1])0x0;
      FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts[9].buffer
      [0] = (char  [1])0x0;
      FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts[10].
      buffer[0] = (char  [1])0x0;
      FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts[0xb].
      buffer[0] = (char  [1])0x0;
      FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts[0xc].
      buffer[0] = (char  [1])0x0;
      FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts[0xd].
      buffer[0] = (char  [1])0x0;
      FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts[0xe].
      buffer[0] = (char  [1])0x0;
      FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts[0xf].
      buffer[0] = (char  [1])0x0;
      uVar2 = this_00->DirIdx;
      local_68 = CVar1;
      if ((this->FormParams).Version < 5) {
        aVar5 = (anon_union_8_2_fc7899a5_for_OptionalStorage<const_char_*,_true>_2)
                FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts
                ._8_8_;
        if ((uVar2 != 0) &&
           (pDVar3 = (this->IncludeDirectories).
                     super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                     ._M_impl.super__Vector_impl_data._M_start,
           uVar2 <= (ulong)(((long)(this->IncludeDirectories).
                                   super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar3 >> 4) *
                           -0x5555555555555555))) {
          OVar6 = DWARFFormValue::getAsCString(pDVar3 + (uVar2 - 1));
          aVar5 = OVar6.Storage.field_0;
          if (((undefined1  [16])OVar6.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_00d7dcf0;
          if (aVar5.value != (char *)0x0) {
            strlen(aVar5.value);
          }
        }
        FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts._8_8_ =
             aVar5;
        aVar5 = (anon_union_8_2_fc7899a5_for_OptionalStorage<const_char_*,_true>_2)
                FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts
                ._8_8_;
        if (CompDir_local.Data != (char *)0x0) {
          Twine::Twine((Twine *)&FileName.Length,
                       (StringRef *)
                       (FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.
                        InlineElts + 8));
          bVar4 = isPathAbsoluteOnWindowsOrPosix((Twine *)&FileName.Length);
          aVar5 = (anon_union_8_2_fc7899a5_for_OptionalStorage<const_char_*,_true>_2)
                  FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.
                  InlineElts._8_8_;
          if (!bVar4) {
            Twine::Twine((Twine *)&FileName.Length,(StringRef *)local_a8);
            Twine::Twine(&local_f0,"");
            Twine::Twine(&local_d8,"");
            Twine::Twine(&local_c0,"");
            sys::path::append((SmallVectorImpl<char> *)&local_68,Style,(Twine *)&FileName.Length,
                              &local_f0,&local_d8,&local_c0);
            aVar5 = (anon_union_8_2_fc7899a5_for_OptionalStorage<const_char_*,_true>_2)
                    FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.
                    InlineElts._8_8_;
          }
        }
      }
      else {
        pDVar3 = (this->IncludeDirectories).
                 super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        aVar5 = (anon_union_8_2_fc7899a5_for_OptionalStorage<const_char_*,_true>_2)
                FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts
                ._8_8_;
        if (uVar2 < (ulong)(((long)(this->IncludeDirectories).
                                   super__Vector_base<llvm::DWARFFormValue,_std::allocator<llvm::DWARFFormValue>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar3 >> 4) *
                           -0x5555555555555555)) {
          OVar6 = DWARFFormValue::getAsCString(pDVar3 + uVar2);
          aVar5 = OVar6.Storage.field_0;
          if (((undefined1  [16])OVar6.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_00d7dcf0:
            __assert_fail("hasVal",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                          ,0xad,
                          "T &llvm::optional_detail::OptionalStorage<const char *>::getValue() & [T = const char *]"
                         );
          }
          if (aVar5.value != (char *)0x0) {
            strlen(aVar5.value);
          }
        }
      }
      FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.InlineElts._8_8_ =
           aVar5;
      Twine::Twine((Twine *)&FileName.Length,
                   (StringRef *)
                   (FilePath.super_SmallVector<char,_16U>.super_SmallVectorStorage<char,_16U>.
                    InlineElts + 8));
      Twine::Twine(&local_f0,(StringRef *)&CompDir_local.Length);
      Twine::Twine(&local_d8,"");
      Twine::Twine(&local_c0,"");
      sys::path::append((SmallVectorImpl<char> *)&local_68,Style,(Twine *)&FileName.Length,&local_f0
                        ,&local_d8,&local_c0);
      if (local_68.twine == (Twine *)0x0) {
        FileName.Length = (size_t)&local_78;
        local_78 = 0;
      }
      else {
        FileName.Length = (size_t)&local_78;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&FileName.Length,local_68.twine,
                   (undefined1 *)
                   ((long)&(local_68.twine)->LHS +
                   ((ulong)FilePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                           super_SmallVectorTemplateBase<char,_true>.
                           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX
                   & 0xffffffff)));
      }
      std::__cxx11::string::operator=((string *)Result,(string *)&FileName.Length);
      if ((undefined1 *)FileName.Length != &local_78) {
        operator_delete((void *)FileName.Length,CONCAT71(uStack_77,local_78) + 1);
      }
      if (local_68.twine == CVar1.twine) {
        return true;
      }
      free(local_68.twine);
      return true;
    }
  }
  local_68 = (Child)&FilePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                     super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  if (CompDir_local.Length == 0) {
    FilePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.BeginX = (void *)0x0;
    FilePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
    super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
    super_SmallVectorBase.Size._0_1_ = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,CompDir_local.Length,FileName.Data + CompDir_local.Length);
  }
  std::__cxx11::string::operator=((string *)Result,(string *)&local_68.character);
  if (local_68.twine !=
      (Twine *)&FilePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                super_SmallVectorTemplateBase<char,_true>.
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size) {
    operator_delete(local_68.twine,
                    CONCAT71(FilePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                             super_SmallVectorTemplateBase<char,_true>.
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase._9_7_
                             ,(undefined1)
                              FilePath.super_SmallVector<char,_16U>.super_SmallVectorImpl<char>.
                              super_SmallVectorTemplateBase<char,_true>.
                              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size
                            ) + 1);
  }
  return true;
}

Assistant:

bool DWARFDebugLine::Prologue::getFileNameByIndex(
    uint64_t FileIndex, StringRef CompDir, FileLineInfoKind Kind,
    std::string &Result, sys::path::Style Style) const {
  if (Kind == FileLineInfoKind::None || !hasFileAtIndex(FileIndex))
    return false;
  const FileNameEntry &Entry = getFileNameEntry(FileIndex);
  StringRef FileName = Entry.Name.getAsCString().getValue();
  if (Kind != FileLineInfoKind::AbsoluteFilePath ||
      isPathAbsoluteOnWindowsOrPosix(FileName)) {
    Result = FileName;
    return true;
  }

  SmallString<16> FilePath;
  StringRef IncludeDir;
  // Be defensive about the contents of Entry.
  if (getVersion() >= 5) {
    if (Entry.DirIdx < IncludeDirectories.size())
      IncludeDir = IncludeDirectories[Entry.DirIdx].getAsCString().getValue();
  } else {
    if (0 < Entry.DirIdx && Entry.DirIdx <= IncludeDirectories.size())
      IncludeDir =
          IncludeDirectories[Entry.DirIdx - 1].getAsCString().getValue();

    // We may still need to append compilation directory of compile unit.
    // We know that FileName is not absolute, the only way to have an
    // absolute path at this point would be if IncludeDir is absolute.
    if (!CompDir.empty() && !isPathAbsoluteOnWindowsOrPosix(IncludeDir))
      sys::path::append(FilePath, Style, CompDir);
  }

  // sys::path::append skips empty strings.
  sys::path::append(FilePath, Style, IncludeDir, FileName);
  Result = FilePath.str();
  return true;
}